

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transcode_utils.cpp
# Opt level: O2

TranscodeSwizzleInfo *
ktx::determineTranscodeSwizzle
          (TranscodeSwizzleInfo *__return_storage_ptr__,KTXTexture2 *texture,Reporter *report)

{
  ktxTexture2 *pkVar1;
  byte bVar2;
  uint32_t uVar3;
  optional<_khr_df_model_channels_e> oVar4;
  optional<_khr_df_model_channels_e> oVar5;
  khr_df_model_channels_e channelType;
  undefined8 in_RCX;
  bool bVar6;
  _Storage<_khr_df_model_channels_e,_true> colorModel;
  _Storage<_khr_df_model_channels_e,_true> colorModel_00;
  allocator<char> local_82;
  allocator<char> local_81;
  Reporter *local_80;
  string *local_78;
  string local_70;
  string local_50;
  
  __return_storage_ptr__->defaultNumComponents = 0;
  (__return_storage_ptr__->swizzle)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->swizzle).field_2;
  (__return_storage_ptr__->swizzle)._M_string_length = 0;
  local_78 = &__return_storage_ptr__->swizzle;
  (__return_storage_ptr__->swizzle).field_2._M_local_buf[0] = '\0';
  pkVar1 = texture->handle_;
  local_80 = report;
  oVar4 = getChannelType(texture,0);
  oVar5 = getChannelType(texture,1);
  bVar6 = oVar4.super__Optional_base<_khr_df_model_channels_e,_true,_true>._M_payload.
          super__Optional_payload_base<_khr_df_model_channels_e>._M_engaged;
  colorModel._M_value =
       oVar4.super__Optional_base<_khr_df_model_channels_e,_true,_true>._M_payload.
       super__Optional_payload_base<_khr_df_model_channels_e>._M_payload;
  if (pkVar1->supercompressionScheme == KTX_SS_BASIS_LZ) {
    bVar2 = ~bVar6;
    colorModel_00._M_value =
         oVar5.super__Optional_base<_khr_df_model_channels_e,_true,_true>._M_payload.
         super__Optional_payload_base<_khr_df_model_channels_e>._M_payload;
    if (colorModel._M_value == KHR_DF_CHANNEL_ASTC_DATA && (bVar2 & 1) == 0) {
      uVar3 = (byte)(colorModel_00._M_value == KHR_DF_CHANNEL_BC2_ALPHA &
                    oVar5.super__Optional_base<_khr_df_model_channels_e,_true,_true>._M_payload.
                    super__Optional_payload_base<_khr_df_model_channels_e>._M_engaged) + 3;
    }
    else {
      channelType = (khr_df_model_channels_e)
                    CONCAT71((int7)((ulong)in_RCX >> 8),
                             colorModel._M_value != KHR_DF_CHANNEL_CMYKSDA_BLACK | bVar2);
      if (colorModel._M_value != KHR_DF_CHANNEL_CMYKSDA_BLACK || (bVar2 & 1) != 0) {
        if (((ulong)oVar4.super__Optional_base<_khr_df_model_channels_e,_true,_true>._M_payload.
                    super__Optional_payload_base<_khr_df_model_channels_e> >> 0x20 & 1) == 0) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"-",&local_81);
        }
        else {
          toString_abi_cxx11_(&local_70,(ktx *)0xa3,colorModel._M_value,channelType);
        }
        if (((ulong)oVar5.super__Optional_base<_khr_df_model_channels_e,_true,_true>._M_payload.
                    super__Optional_payload_base<_khr_df_model_channels_e> >> 0x20 & 1) == 0) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"-",&local_82);
        }
        else {
          toString_abi_cxx11_(&local_50,(ktx *)0xa3,colorModel_00._M_value,channelType);
        }
        Reporter::fatal<char_const(&)[59],std::__cxx11::string,std::__cxx11::string>
                  (local_80,INVALID_FILE,
                   (char (*) [59])"Unsupported channel types for Basis-LZ transcoding: {}, {}",
                   &local_70,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
LAB_001877ae:
        std::__cxx11::string::~string((string *)&local_70);
        return __return_storage_ptr__;
      }
      uVar3 = (byte)(colorModel_00._M_value == KHR_DF_CHANNEL_ETC1S_GGG &
                    oVar5.super__Optional_base<_khr_df_model_channels_e,_true,_true>._M_payload.
                    super__Optional_payload_base<_khr_df_model_channels_e>._M_engaged) + 1;
    }
  }
  else {
    if ((char)pkVar1->pDfd[3] != -0x5a) {
      Reporter::fatal<char_const(&)[67]>
                (local_80,INVALID_FILE,
                 (char (*) [67])"Requested transcoding but input file is neither BasisLZ, nor UASTC"
                );
      return __return_storage_ptr__;
    }
    if ((colorModel._M_value == KHR_DF_CHANNEL_CMYKSDA_BLACK & bVar6) == 0) {
      if ((colorModel._M_value == KHR_DF_CHANNEL_ASTC_DATA & bVar6) == 0) {
        uVar3 = 2;
        if ((((colorModel._M_value == KHR_DF_CHANNEL_UASTC_RRRG & bVar6) == 0) &&
            ((colorModel._M_value == KHR_DF_CHANNEL_UASTC_RG & bVar6) == 0)) &&
           (uVar3 = 1, (~bVar6 & 1U) != 0 || colorModel._M_value != KHR_DF_CHANNEL_ETC1S_GGG)) {
          if (((ulong)oVar4.super__Optional_base<_khr_df_model_channels_e,_true,_true>._M_payload.
                      super__Optional_payload_base<_khr_df_model_channels_e> >> 0x20 & 1) == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_70,"-",(allocator<char> *)&local_50);
          }
          else {
            toString_abi_cxx11_(&local_70,(ktx *)0xa6,colorModel._M_value,
                                (khr_df_model_channels_e)
                                CONCAT71(oVar4.
                                         super__Optional_base<_khr_df_model_channels_e,_true,_true>.
                                         _M_payload.
                                         super__Optional_payload_base<_khr_df_model_channels_e>.
                                         _1_7_ >> 0x20,
                                         ~bVar6 | colorModel._M_value != KHR_DF_CHANNEL_ETC1S_GGG));
          }
          Reporter::fatal<char_const(&)[51],std::__cxx11::string>
                    (local_80,INVALID_FILE,
                     (char (*) [51])"Unsupported channel type for UASTC transcoding: {}",&local_70);
          goto LAB_001877ae;
        }
      }
      else {
        uVar3 = 3;
      }
    }
    else {
      uVar3 = 4;
    }
  }
  __return_storage_ptr__->defaultNumComponents = uVar3;
  std::__cxx11::string::assign((char *)local_78);
  return __return_storage_ptr__;
}

Assistant:

TranscodeSwizzleInfo determineTranscodeSwizzle(const KTXTexture2& texture, Reporter& report) {
    TranscodeSwizzleInfo result;

    const auto* bdfd = texture->pDfd + 1;
    const auto sample0 = getChannelType(texture, 0);
    const auto sample1 = getChannelType(texture, 1);

    if (texture->supercompressionScheme == KTX_SS_BASIS_LZ) {
        result.defaultNumComponents = 0;
        if (sample0 == KHR_DF_CHANNEL_ETC1S_RGB && sample1 == KHR_DF_CHANNEL_ETC1S_AAA) {
            result.defaultNumComponents = 4;
            result.swizzle = "rgba";
        } else if (sample0 == KHR_DF_CHANNEL_ETC1S_RGB) {
            result.defaultNumComponents = 3;
            result.swizzle = "rgb1";
        } else if (sample0 == KHR_DF_CHANNEL_ETC1S_RRR && sample1 == KHR_DF_CHANNEL_ETC1S_GGG) {
            result.defaultNumComponents = 2;
            result.swizzle = "ra01";
        } else if (sample0 == KHR_DF_CHANNEL_ETC1S_RRR) {
            result.defaultNumComponents = 1;
            result.swizzle = "r001";
        } else {
            report.fatal(rc::INVALID_FILE, "Unsupported channel types for Basis-LZ transcoding: {}, {}",
                    sample0 ? toString(KHR_DF_MODEL_ETC1S, *sample0) : "-",
                    sample1 ? toString(KHR_DF_MODEL_ETC1S, *sample1) : "-");
        }
    } else if (khr_df_model_e(KHR_DFDVAL(bdfd, MODEL)) == KHR_DF_MODEL_UASTC) {
        result.defaultNumComponents = 0;
        if (sample0 == KHR_DF_CHANNEL_UASTC_RGBA) {
            result.defaultNumComponents = 4;
            result.swizzle = "rgba";
        } else if (sample0 == KHR_DF_CHANNEL_UASTC_RGB) {
            result.defaultNumComponents = 3;
            result.swizzle = "rgb1";
        } else if (sample0 == KHR_DF_CHANNEL_UASTC_RRRG) {
            result.defaultNumComponents = 2;
            result.swizzle = "ra01";
        } else if (sample0 == KHR_DF_CHANNEL_UASTC_RG) {
            result.defaultNumComponents = 2;
            result.swizzle = "rg01";
        } else if (sample0 == KHR_DF_CHANNEL_UASTC_RRR) {
            result.defaultNumComponents = 1;
            result.swizzle = "r001";
        } else {
            report.fatal(rc::INVALID_FILE, "Unsupported channel type for UASTC transcoding: {}",
                    sample0 ? toString(KHR_DF_MODEL_UASTC, *sample0) : "-");
        }
    } else {
        report.fatal(rc::INVALID_FILE, "Requested transcoding but input file is neither BasisLZ, nor UASTC");
    }

    return result;
}